

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O3

void QTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_3c = *_a[1];
    local_30 = &local_3c;
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
  }
  if (_c == ReadProperty) {
    if (_id == 0) {
      puVar1 = (undefined4 *)*_a;
      uVar2 = ::QVariant::toTime();
      *puVar1 = uVar2;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      QDateTimeEdit::setTime((QDateTimeEdit *)_o,(QTime)**_a);
    }
  }
  else if (((_c == IndexOfMethod) && (*_a[1] == userTimeChanged)) &&
          (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userTimeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeEdit::*)(QTime )>(_a, &QTimeEdit::userTimeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        default: break;
        }
    }
}